

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall B::~B(B *this)

{
  ~B(this);
  operator_delete(this);
  return;
}

Assistant:

~B(){ cout << hex << (long)this << " B destructor!" << endl; }